

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRHeader(EXRHeader *exr_header)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  
  if (exr_header == (EXRHeader *)0x0) {
    iVar1 = -3;
  }
  else {
    free(exr_header->channels);
    free(exr_header->pixel_types);
    free(exr_header->requested_pixel_types);
    lVar2 = 0x200;
    for (lVar3 = 0; lVar3 < exr_header->num_custom_attributes; lVar3 = lVar3 + 1) {
      free(*(void **)(exr_header->custom_attributes->name + lVar2));
      lVar2 = lVar2 + 0x210;
    }
    free(exr_header->custom_attributes);
    iVar1 = 0;
    memset(exr_header->name,0,0x100);
  }
  return iVar1;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  if (exr_header->custom_attributes) {
    free(exr_header->custom_attributes);
  }

  EXRSetNameAttr(exr_header, NULL);

  return TINYEXR_SUCCESS;
}